

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

ZSTD_frameSizeInfo *
ZSTD_findFrameSizeInfo(ZSTD_frameSizeInfo *__return_storage_ptr__,void *src,size_t srcSize)

{
  ushort uVar1;
  ZSTD_frameSizeInfo *pZVar2;
  ZSTD_frameSizeInfo *pZVar3;
  unsigned_long_long uVar4;
  size_t sVar5;
  ulong uVar6;
  ushort uVar7;
  ulong uVar8;
  bool bVar9;
  ZSTD_frameHeader zfh;
  ZSTD_frameHeader local_48;
  
  if ((7 < srcSize) && ((*src & 0xfffffff0) == 0x184d2a50)) {
    pZVar2 = (ZSTD_frameSizeInfo *)0xfffffffffffffff2;
    if (*(uint *)((long)src + 4) >> 3 < 0x1fffffff) {
      pZVar3 = (ZSTD_frameSizeInfo *)((ulong)*(uint *)((long)src + 4) + 8);
      pZVar2 = (ZSTD_frameSizeInfo *)0xffffffffffffffb8;
      if (pZVar3 <= srcSize) {
        pZVar2 = pZVar3;
      }
      if (srcSize < pZVar2 && pZVar2 < (ZSTD_frameSizeInfo *)0xffffffffffffff89) {
        __assert_fail("ZSTD_isError(frameSizeInfo.compressedSize) || frameSizeInfo.compressedSize <= srcSize"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x9e32,"ZSTD_frameSizeInfo ZSTD_findFrameSizeInfo(const void *, size_t)");
      }
    }
    uVar4 = 0;
    __return_storage_ptr__->nbBlocks = 0;
    __return_storage_ptr__->compressedSize = (size_t)pZVar2;
    goto LAB_0017bedb;
  }
  pZVar2 = (ZSTD_frameSizeInfo *)ZSTD_getFrameHeader_advanced(&local_48,src,srcSize,ZSTD_f_zstd1);
  uVar4 = 0xfffffffffffffffe;
  pZVar3 = pZVar2;
  if ((pZVar2 < (ZSTD_frameSizeInfo *)0xffffffffffffff89) &&
     (pZVar3 = (ZSTD_frameSizeInfo *)0xffffffffffffffb8, pZVar2 == (ZSTD_frameSizeInfo *)0x0)) {
    pZVar2 = (ZSTD_frameSizeInfo *)((long)src + (ulong)local_48.headerSize);
    uVar8 = srcSize - local_48.headerSize;
    sVar5 = 0;
    do {
      if (uVar8 < 3) goto LAB_0017bed7;
      uVar1 = (ushort)pZVar2->nbBlocks;
      uVar7 = uVar1 >> 1 & 3;
      uVar6 = 4;
      if (uVar7 != 1) {
        if (uVar7 == 3) {
          pZVar3 = (ZSTD_frameSizeInfo *)0xffffffffffffffec;
          goto LAB_0017bed7;
        }
        uVar6 = (ulong)((uint3)(CONCAT12(*(undefined1 *)((long)&pZVar2->nbBlocks + 2),uVar1) >> 3) +
                       3);
      }
      bVar9 = uVar8 < uVar6;
      uVar8 = uVar8 - uVar6;
      if (bVar9) goto LAB_0017bed7;
      pZVar2 = (ZSTD_frameSizeInfo *)((long)&pZVar2->nbBlocks + uVar6);
      sVar5 = sVar5 + 1;
    } while ((uVar1 & 1) == 0);
    if (local_48.checksumFlag != 0) {
      if (uVar8 < 4) goto LAB_0017bed7;
      pZVar2 = (ZSTD_frameSizeInfo *)((long)&pZVar2->nbBlocks + 4);
    }
    pZVar2 = (ZSTD_frameSizeInfo *)((long)pZVar2 - (long)src);
    uVar4 = local_48.blockSizeMax * sVar5;
    if (local_48.frameContentSize != 0xffffffffffffffff) {
      uVar4 = local_48.frameContentSize;
    }
    __return_storage_ptr__->nbBlocks = sVar5;
    pZVar3 = pZVar2;
  }
LAB_0017bed7:
  __return_storage_ptr__->compressedSize = (size_t)pZVar3;
LAB_0017bedb:
  __return_storage_ptr__->decompressedBound = uVar4;
  return pZVar2;
}

Assistant:

static ZSTD_frameSizeInfo ZSTD_findFrameSizeInfo(const void* src, size_t srcSize)
{
    ZSTD_frameSizeInfo frameSizeInfo;
    ZSTD_memset(&frameSizeInfo, 0, sizeof(ZSTD_frameSizeInfo));

#if defined(ZSTD_LEGACY_SUPPORT) && (ZSTD_LEGACY_SUPPORT >= 1)
    if (ZSTD_isLegacy(src, srcSize))
        return ZSTD_findFrameSizeInfoLegacy(src, srcSize);
#endif

    if ((srcSize >= ZSTD_SKIPPABLEHEADERSIZE)
        && (MEM_readLE32(src) & ZSTD_MAGIC_SKIPPABLE_MASK) == ZSTD_MAGIC_SKIPPABLE_START) {
        frameSizeInfo.compressedSize = readSkippableFrameSize(src, srcSize);
        assert(ZSTD_isError(frameSizeInfo.compressedSize) ||
               frameSizeInfo.compressedSize <= srcSize);
        return frameSizeInfo;
    } else {
        const BYTE* ip = (const BYTE*)src;
        const BYTE* const ipstart = ip;
        size_t remainingSize = srcSize;
        size_t nbBlocks = 0;
        ZSTD_frameHeader zfh;

        /* Extract Frame Header */
        {   size_t const ret = ZSTD_getFrameHeader(&zfh, src, srcSize);
            if (ZSTD_isError(ret))
                return ZSTD_errorFrameSizeInfo(ret);
            if (ret > 0)
                return ZSTD_errorFrameSizeInfo(ERROR(srcSize_wrong));
        }

        ip += zfh.headerSize;
        remainingSize -= zfh.headerSize;

        /* Iterate over each block */
        while (1) {
            blockProperties_t blockProperties;
            size_t const cBlockSize = ZSTD_getcBlockSize(ip, remainingSize, &blockProperties);
            if (ZSTD_isError(cBlockSize))
                return ZSTD_errorFrameSizeInfo(cBlockSize);

            if (ZSTD_blockHeaderSize + cBlockSize > remainingSize)
                return ZSTD_errorFrameSizeInfo(ERROR(srcSize_wrong));

            ip += ZSTD_blockHeaderSize + cBlockSize;
            remainingSize -= ZSTD_blockHeaderSize + cBlockSize;
            nbBlocks++;

            if (blockProperties.lastBlock) break;
        }

        /* Final frame content checksum */
        if (zfh.checksumFlag) {
            if (remainingSize < 4)
                return ZSTD_errorFrameSizeInfo(ERROR(srcSize_wrong));
            ip += 4;
        }

        frameSizeInfo.nbBlocks = nbBlocks;
        frameSizeInfo.compressedSize = (size_t)(ip - ipstart);
        frameSizeInfo.decompressedBound = (zfh.frameContentSize != ZSTD_CONTENTSIZE_UNKNOWN)
                                        ? zfh.frameContentSize
                                        : (unsigned long long)nbBlocks * zfh.blockSizeMax;
        return frameSizeInfo;
    }
}